

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Schema * sqlite3SchemaGet(sqlite3 *db,Btree *pBt)

{
  Schema *pSVar1;
  
  if (pBt == (Btree *)0x0) {
    pSVar1 = (Schema *)sqlite3DbMallocZero((sqlite3 *)0x0,0x78);
  }
  else {
    pSVar1 = (Schema *)sqlite3BtreeSchema(pBt,0x78,sqlite3SchemaClear);
  }
  if (pSVar1 == (Schema *)0x0) {
    db->mallocFailed = '\x01';
  }
  else if (pSVar1->file_format == '\0') {
    (pSVar1->fkeyHash).first = (HashElem *)0x0;
    (pSVar1->fkeyHash).ht = (_ht *)0x0;
    (pSVar1->trigHash).ht = (_ht *)0x0;
    (pSVar1->fkeyHash).htsize = 0;
    (pSVar1->fkeyHash).count = 0;
    (pSVar1->trigHash).htsize = 0;
    (pSVar1->trigHash).count = 0;
    (pSVar1->trigHash).first = (HashElem *)0x0;
    (pSVar1->idxHash).first = (HashElem *)0x0;
    (pSVar1->idxHash).ht = (_ht *)0x0;
    (pSVar1->tblHash).ht = (_ht *)0x0;
    (pSVar1->idxHash).htsize = 0;
    (pSVar1->idxHash).count = 0;
    (pSVar1->tblHash).htsize = 0;
    (pSVar1->tblHash).count = 0;
    (pSVar1->tblHash).first = (HashElem *)0x0;
    pSVar1->enc = '\x01';
  }
  return pSVar1;
}

Assistant:

SQLITE_PRIVATE Schema *sqlite3SchemaGet(sqlite3 *db, Btree *pBt){
  Schema * p;
  if( pBt ){
    p = (Schema *)sqlite3BtreeSchema(pBt, sizeof(Schema), sqlite3SchemaClear);
  }else{
    p = (Schema *)sqlite3DbMallocZero(0, sizeof(Schema));
  }
  if( !p ){
    db->mallocFailed = 1;
  }else if ( 0==p->file_format ){
    sqlite3HashInit(&p->tblHash);
    sqlite3HashInit(&p->idxHash);
    sqlite3HashInit(&p->trigHash);
    sqlite3HashInit(&p->fkeyHash);
    p->enc = SQLITE_UTF8;
  }
  return p;
}